

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_radio_text(nk_context *ctx,char *text,int len,int *active)

{
  int is_active;
  int iVar1;
  int old_value;
  int *active_local;
  int len_local;
  char *text_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x4fc8,"int nk_radio_text(struct nk_context *, const char *, int, int *)");
  }
  if (text != (char *)0x0) {
    if (active != (int *)0x0) {
      if (((ctx == (nk_context *)0x0) || (text == (char *)0x0)) || (active == (int *)0x0)) {
        ctx_local._4_4_ = 0;
      }
      else {
        is_active = *active;
        iVar1 = nk_option_text(ctx,text,len,is_active);
        *active = iVar1;
        ctx_local._4_4_ = (uint)(is_active != *active);
      }
      return ctx_local._4_4_;
    }
    __assert_fail("active",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x4fca,"int nk_radio_text(struct nk_context *, const char *, int, int *)");
  }
  __assert_fail("text",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x4fc9,"int nk_radio_text(struct nk_context *, const char *, int, int *)");
}

Assistant:

NK_API int
nk_radio_text(struct nk_context *ctx, const char *text, int len, int *active)
{
    int old_value;
    NK_ASSERT(ctx);
    NK_ASSERT(text);
    NK_ASSERT(active);
    if (!ctx || !text || !active) return 0;
    old_value = *active;
    *active = nk_option_text(ctx, text, len, old_value);
    return old_value != *active;
}